

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O2

int vardata_add_feature(vardata *data,char *name,char *description)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  vardata_feature *pvVar5;
  int iVar6;
  
  if (data->validated == 0) {
    iVar1 = symtab_put(data->symtab,name,0,data->featuresnum);
    if (iVar1 == -1) {
      iVar1 = -1;
    }
    else {
      iVar1 = data->featuresnum;
      pcVar3 = strdup(name);
      if (description == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = strdup(description);
      }
      iVar6 = data->featuresmax;
      if (iVar1 < iVar6) {
        pvVar5 = data->features;
        iVar6 = iVar1;
      }
      else {
        iVar2 = 0x10;
        if (iVar6 != 0) {
          iVar2 = iVar6 * 2;
        }
        data->featuresmax = iVar2;
        pvVar5 = (vardata_feature *)realloc(data->features,(long)iVar2 << 6);
        data->features = pvVar5;
        iVar6 = data->featuresnum;
      }
      data->featuresnum = iVar6 + 1;
      pvVar5[iVar6].name = pcVar3;
      pvVar5[iVar6].description = pcVar4;
      pvVar5[iVar6].ifmask = (uint32_t *)0x0;
      (&pvVar5[iVar6].ifmask)[1] = (uint32_t *)0x0;
      pvVar5[iVar6].implies = (int *)0x0;
      (&pvVar5[iVar6].implies)[1] = (int *)0x0;
      pvVar5[iVar6].conflicts = (int *)0x0;
      (&pvVar5[iVar6].conflicts)[1] = (int *)0x0;
    }
    return iVar1;
  }
  abort();
}

Assistant:

int vardata_add_feature(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_FEATURE, data->featuresnum) == -1)
		return -1;
	int res = data->featuresnum;
	struct vardata_feature new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->features, new);
	return res;
}